

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42parse.c
# Opt level: O1

void t42_parse_sfnts(T42_Face face,T42_Loader loader)

{
  byte bVar1;
  byte *pbVar2;
  FT_Byte *pFVar3;
  bool bVar4;
  FT_Error FVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  FT_Byte *pFVar8;
  char cVar9;
  ulong new_count;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  byte *pbVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  FT_Error error;
  FT_ULong real_size;
  FT_Error local_74;
  FT_Byte *local_70;
  byte *local_68;
  undefined8 local_60;
  uint local_54;
  ulong local_50;
  FT_Memory local_48;
  FT_Offset local_40;
  ulong local_38;
  
  pbVar13 = (loader->parser).root.limit;
  local_48 = (loader->parser).root.memory;
  (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
  pbVar2 = (loader->parser).root.cursor;
  if ((pbVar2 < pbVar13) && ((loader->parser).root.cursor = pbVar2 + 1, *pbVar2 == 0x5b)) {
    (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
    local_40 = 0;
    pFVar8 = (FT_Byte *)0x0;
    local_60 = 0;
    iVar15 = 0;
    uVar11 = 0;
    lVar16 = 0;
    local_54 = 0;
    local_68 = pbVar13;
    do {
      pbVar2 = (loader->parser).root.cursor;
      if (pbVar13 <= pbVar2) {
        local_74 = 3;
        goto LAB_0017cd85;
      }
      bVar1 = *pbVar2;
      if (bVar1 == 0x3c) {
        local_70 = (FT_Byte *)CONCAT44(local_70._4_4_,iVar15);
        (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
        iVar7 = 7;
        if ((loader->parser).root.error == 0) {
          pFVar3 = (loader->parser).root.cursor;
          if (2 < (ulong)((long)pFVar3 - (long)pbVar2)) {
            uVar11 = (long)(pFVar3 + ~(ulong)pbVar2) / 2;
            pFVar8 = (FT_Byte *)ft_mem_realloc(local_48,1,local_40,uVar11,pFVar8,&local_74);
            iVar7 = 4;
            iVar15 = (int)local_70;
            pbVar13 = local_68;
            if (local_74 == 0) {
              (loader->parser).root.cursor = pbVar2;
              FVar5 = (*(loader->parser).root.funcs.to_bytes)
                                ((PS_Parser)loader,pFVar8,uVar11,&local_38,'\x01');
              local_60 = CONCAT71((int7)(CONCAT44(extraout_var,FVar5) >> 8),1);
              pbVar13 = local_68;
              uVar10 = local_38;
              local_40 = uVar11;
              goto LAB_0017caa3;
            }
            goto LAB_0017cc9a;
          }
          local_74 = 3;
          iVar7 = 4;
          uVar11 = 0;
        }
        pbVar13 = local_68;
        iVar15 = (int)local_70;
      }
      else if (bVar1 == 0x5d) {
        (loader->parser).root.cursor = pbVar2 + 1;
        iVar7 = 7;
      }
      else {
        uVar10 = uVar11;
        if (bVar1 - 0x30 < 10) {
          if ((char)local_60 == '\0') {
            local_70 = pFVar8;
            uVar10 = (*(loader->parser).root.funcs.to_int)((PS_Parser)loader);
            if ((long)uVar10 < 0) {
              local_74 = 3;
              iVar7 = 4;
              bVar4 = false;
              pFVar8 = local_70;
            }
            else {
              (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
              uVar11 = uVar10;
              if ((loader->parser).root.error == 0) {
                pFVar3 = (loader->parser).root.cursor;
                pFVar8 = pFVar3 + 1;
                if ((ulong)((long)pbVar13 - (long)pFVar3) <= uVar10) goto LAB_0017c990;
                (loader->parser).root.cursor = pFVar3 + uVar10 + 1;
                iVar7 = 0;
                bVar4 = true;
              }
              else {
                iVar7 = 1;
                bVar4 = false;
                pFVar8 = local_70;
              }
            }
          }
          else {
LAB_0017c990:
            local_74 = 3;
            iVar7 = 4;
            bVar4 = false;
            uVar11 = uVar10;
          }
          uVar10 = uVar11;
          if (!bVar4) goto LAB_0017cc9a;
        }
LAB_0017caa3:
        uVar11 = uVar10;
        if (pFVar8 == (FT_Byte *)0x0) {
          local_74 = 3;
          iVar7 = 4;
          pFVar8 = (FT_Byte *)0x0;
        }
        else {
          if (((uVar10 & 1) != 0) && (pFVar8[uVar10 - 1] == '\0')) {
            uVar11 = uVar10 - 1;
          }
          if (uVar11 == 0) {
            local_74 = 3;
            iVar7 = 4;
            uVar11 = 0;
          }
          else {
            uVar12 = (long)pbVar13 - (long)(loader->parser).root.cursor;
            uVar10 = 0;
            local_70 = pFVar8;
            local_50 = uVar11;
            do {
              if (iVar15 == 2) {
LAB_0017cc39:
                if (face->ttf_size <= lVar16) {
                  local_74 = 3;
                  iVar7 = 4;
                  pbVar13 = local_68;
                  goto LAB_0017cc9a;
                }
              }
              else if (iVar15 == 1) {
LAB_0017cb5c:
                iVar15 = 1;
                if (face->ttf_size <= lVar16) {
                  if (0 < (int)local_54) {
                    lVar14 = 0;
                    do {
                      uVar6 = *(uint *)(face->ttf_data + lVar14 + 0x18);
                      uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                              uVar6 << 0x18;
                      if ((uVar12 < uVar6) || ((long)(uVar12 - uVar6) < face->ttf_size)) {
                        local_74 = 3;
                        iVar7 = 4;
                        bVar4 = false;
                      }
                      else {
                        face->ttf_size = face->ttf_size + (ulong)(uVar6 + 3 & 0xfffffffc);
                        iVar7 = 0;
                        bVar4 = true;
                      }
                      if (!bVar4) {
                        iVar15 = 1;
                        goto LAB_0017cc31;
                      }
                      lVar14 = lVar14 + 0x10;
                    } while ((ulong)local_54 << 4 != lVar14);
                  }
                  pFVar8 = (FT_Byte *)
                           ft_mem_realloc(local_48,1,(ulong)(local_54 << 4 | 0xc),face->ttf_size + 1
                                          ,face->ttf_data,&local_74);
                  face->ttf_data = pFVar8;
                  iVar7 = (uint)(local_74 != 0) << 2;
                  iVar15 = 2;
                  pFVar8 = local_70;
                  uVar11 = local_50;
LAB_0017cc31:
                  pbVar13 = local_68;
                  if (iVar7 == 0) goto LAB_0017cc39;
                  goto LAB_0017cc9a;
                }
              }
              else {
                iVar15 = 0;
                if (0xb < lVar16) {
                  pFVar3 = face->ttf_data;
                  local_54 = (uint)pFVar3[5] + (uint)pFVar3[4] * 0x10;
                  new_count = (ulong)(local_54 * 0x10 | 0xc);
                  face->ttf_size = new_count;
                  if ((long)uVar12 < (long)new_count) {
                    local_74 = 3;
                    iVar7 = 4;
                    pbVar13 = local_68;
                    iVar15 = 1;
                  }
                  else {
                    pFVar8 = (FT_Byte *)ft_mem_realloc(local_48,1,0xc,new_count,pFVar3,&local_74);
                    face->ttf_data = pFVar8;
                    pFVar8 = local_70;
                    uVar11 = local_50;
                    if (local_74 == 0) goto LAB_0017cb5c;
                    iVar7 = 4;
                    pbVar13 = local_68;
                    iVar15 = 1;
                  }
                  goto LAB_0017cc9a;
                }
              }
              face->ttf_data[lVar16] = pFVar8[uVar10];
              lVar16 = lVar16 + 1;
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar11);
            (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
            iVar7 = 0;
            pbVar13 = local_68;
            pFVar8 = local_70;
            uVar11 = local_50;
          }
        }
      }
LAB_0017cc9a:
    } while (iVar7 == 0);
    if (iVar7 != 4) {
      cVar9 = (char)local_60;
      if (iVar7 != 7) {
        return;
      }
      goto LAB_0017cd4c;
    }
LAB_0017cd85:
    cVar9 = (char)local_60;
  }
  else {
    local_74 = 3;
    pFVar8 = (FT_Byte *)0x0;
    cVar9 = '\0';
  }
  (loader->parser).root.error = local_74;
LAB_0017cd4c:
  if (cVar9 != '\0') {
    ft_mem_free(local_48,pFVar8);
  }
  return;
}

Assistant:

static void
  t42_parse_sfnts( T42_Face    face,
                   T42_Loader  loader )
  {
    T42_Parser  parser = &loader->parser;
    FT_Memory   memory = parser->root.memory;
    FT_Byte*    cur;
    FT_Byte*    limit  = parser->root.limit;
    FT_Error    error;
    FT_Int      num_tables = 0;
    FT_Long     count;

    FT_ULong    n, string_size, old_string_size, real_size;
    FT_Byte*    string_buf = NULL;
    FT_Bool     allocated  = 0;

    T42_Load_Status  status;


    /* The format is                                */
    /*                                              */
    /*   /sfnts [ <hexstring> <hexstring> ... ] def */
    /*                                              */
    /* or                                           */
    /*                                              */
    /*   /sfnts [                                   */
    /*      <num_bin_bytes> RD <binary data>        */
    /*      <num_bin_bytes> RD <binary data>        */
    /*      ...                                     */
    /*   ] def                                      */
    /*                                              */
    /* with exactly one space after the `RD' token. */

    T1_Skip_Spaces( parser );

    if ( parser->root.cursor >= limit || *parser->root.cursor++ != '[' )
    {
      FT_ERROR(( "t42_parse_sfnts: can't find begin of sfnts vector\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Fail;
    }

    T1_Skip_Spaces( parser );
    status          = BEFORE_START;
    string_size     = 0;
    old_string_size = 0;
    count           = 0;

    while ( parser->root.cursor < limit )
    {
      FT_ULong  size;


      cur = parser->root.cursor;

      if ( *cur == ']' )
      {
        parser->root.cursor++;
        goto Exit;
      }

      else if ( *cur == '<' )
      {
        T1_Skip_PS_Token( parser );
        if ( parser->root.error )
          goto Exit;

        /* don't include delimiters */
        string_size = (FT_ULong)( ( parser->root.cursor - cur - 2 + 1 ) / 2 );
        if ( !string_size )
        {
          FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        if ( FT_REALLOC( string_buf, old_string_size, string_size ) )
          goto Fail;

        allocated = 1;

        parser->root.cursor = cur;
        (void)T1_ToBytes( parser, string_buf, string_size, &real_size, 1 );
        old_string_size = string_size;
        string_size     = real_size;
      }

      else if ( ft_isdigit( *cur ) )
      {
        FT_Long  tmp;


        if ( allocated )
        {
          FT_ERROR(( "t42_parse_sfnts: "
                     "can't handle mixed binary and hex strings\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

        tmp = T1_ToInt( parser );
        if ( tmp < 0 )
        {
          FT_ERROR(( "t42_parse_sfnts: invalid string size\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        else
          string_size = (FT_ULong)tmp;

        T1_Skip_PS_Token( parser );             /* `RD' */
        if ( parser->root.error )
          return;

        string_buf = parser->root.cursor + 1;   /* one space after `RD' */

        if ( (FT_ULong)( limit - parser->root.cursor ) <= string_size )
        {
          FT_ERROR(( "t42_parse_sfnts: too much binary data\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        else
          parser->root.cursor += string_size + 1;
      }

      if ( !string_buf )
      {
        FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }

      /* A string can have a trailing zero (odd) byte for padding. */
      /* Ignore it.                                                */
      if ( ( string_size & 1 ) && string_buf[string_size - 1] == 0 )
        string_size--;

      if ( !string_size )
      {
        FT_ERROR(( "t42_parse_sfnts: invalid string\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }

      /* The whole TTF is now loaded into `string_buf'.  We are */
      /* checking its contents while copying it to `ttf_data'.  */

      size = (FT_ULong)( limit - parser->root.cursor );

      for ( n = 0; n < string_size; n++ )
      {
        switch ( status )
        {
        case BEFORE_START:
          /* load offset table, 12 bytes */
          if ( count < 12 )
          {
            face->ttf_data[count++] = string_buf[n];
            continue;
          }
          else
          {
            num_tables     = 16 * face->ttf_data[4] + face->ttf_data[5];
            status         = BEFORE_TABLE_DIR;
            face->ttf_size = 12 + 16 * num_tables;

            if ( (FT_Long)size < face->ttf_size )
            {
              FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
              error = FT_THROW( Invalid_File_Format );
              goto Fail;
            }

            if ( FT_REALLOC( face->ttf_data, 12, face->ttf_size ) )
              goto Fail;
          }
          /* fall through */

        case BEFORE_TABLE_DIR:
          /* the offset table is read; read the table directory */
          if ( count < face->ttf_size )
          {
            face->ttf_data[count++] = string_buf[n];
            continue;
          }
          else
          {
            int       i;
            FT_ULong  len;


            for ( i = 0; i < num_tables; i++ )
            {
              FT_Byte*  p = face->ttf_data + 12 + 16 * i + 12;


              len = FT_PEEK_ULONG( p );
              if ( len > size                               ||
                   face->ttf_size > (FT_Long)( size - len ) )
              {
                FT_ERROR(( "t42_parse_sfnts:"
                           " invalid data in sfnts array\n" ));
                error = FT_THROW( Invalid_File_Format );
                goto Fail;
              }

              /* Pad to a 4-byte boundary length */
              face->ttf_size += (FT_Long)( ( len + 3 ) & ~3U );
            }

            status = OTHER_TABLES;

            if ( FT_REALLOC( face->ttf_data, 12 + 16 * num_tables,
                             face->ttf_size + 1 ) )
              goto Fail;
          }
          /* fall through */

        case OTHER_TABLES:
          /* all other tables are just copied */
          if ( count >= face->ttf_size )
          {
            FT_ERROR(( "t42_parse_sfnts: too much binary data\n" ));
            error = FT_THROW( Invalid_File_Format );
            goto Fail;
          }
          face->ttf_data[count++] = string_buf[n];
        }
      }

      T1_Skip_Spaces( parser );
    }

    /* if control reaches this point, the format was not valid */
    error = FT_THROW( Invalid_File_Format );

  Fail:
    parser->root.error = error;

  Exit:
    if ( allocated )
      FT_FREE( string_buf );
  }